

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O0

void __thiscall
fmt::v5::internal::
chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
::on_second(chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
            *this,numeric_system ns)

{
  bool bVar1;
  int iVar2;
  rep value;
  size_t in_RCX;
  int in_ESI;
  chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
  *in_RDI;
  tm time;
  char *in_stack_000001f0;
  tm *in_stack_000001f8;
  chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
  *in_stack_00000200;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff88;
  milliseconds *__lhs;
  int local_60 [14];
  back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_> local_28;
  undefined1 local_1d;
  int local_1c;
  duration<long,std::ratio<1l,1000l>> local_18 [24];
  
  if (in_ESI == 0) {
    iVar2 = second((chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
                    *)0x13346c);
    write(in_RDI,iVar2,(void *)0x2,in_RCX);
    __lhs = &in_RDI->ms;
    local_1c = 0;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_18,&local_1c);
    bVar1 = std::chrono::operator!=(__lhs,in_stack_ffffffffffffff88);
    if (bVar1) {
      local_1d = 0x2e;
      local_28 = std::
                 back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>
                 ::operator++(&in_RDI->out,0);
      std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>::
      operator*(&local_28);
      std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>::
      operator=((back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>
                 *)__lhs,(value_type *)in_stack_ffffffffffffff88);
      value = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&in_RDI->ms);
      iVar2 = to_int<long>(value);
      write(in_RDI,iVar2,(void *)0x3,in_RCX);
    }
  }
  else {
    memset(local_60,0,0x38);
    local_60[0] = second((chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
                          *)0x13352c);
    format_localized(in_stack_00000200,in_stack_000001f8,in_stack_000001f0);
  }
  return;
}

Assistant:

void on_second(numeric_system ns) {
    if (ns == numeric_system::standard) {
      write(second(), 2);
      if (ms != std::chrono::milliseconds(0)) {
        *out++ = '.';
        write(to_int(ms.count()), 3);
      }
      return;
    }
    auto time = tm();
    time.tm_sec = second();
    format_localized(time, "%OS");
  }